

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

XrResult RuntimeTestXrGetInstanceProcAddr
                   (XrInstance instance,char *name,PFN_xrVoidFunction *function)

{
  int iVar1;
  PFN_xrVoidFunction *function_local;
  char *name_local;
  XrInstance instance_local;
  
  iVar1 = strcmp(name,"xrGetInstanceProcAddr");
  if (iVar1 == 0) {
    *function = RuntimeTestXrGetInstanceProcAddr;
  }
  else {
    iVar1 = strcmp(name,"xrEnumerateInstanceExtensionProperties");
    if (iVar1 == 0) {
      *function = RuntimeTestXrEnumerateInstanceExtensionProperties;
    }
    else {
      iVar1 = strcmp(name,"xrCreateInstance");
      if (iVar1 == 0) {
        *function = RuntimeTestXrCreateInstance;
      }
    }
  }
  if (instance == (XrInstance)0x0) {
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
  }
  else {
    iVar1 = strcmp(name,"xrDestroyInstance");
    if (iVar1 == 0) {
      *function = RuntimeTestXrDestroyInstance;
    }
    else {
      iVar1 = strcmp(name,"xrGetSystem");
      if (iVar1 == 0) {
        *function = RuntimeTestXrGetSystem;
      }
      else {
        iVar1 = strcmp(name,"xrGetSystemProperties");
        if (iVar1 == 0) {
          *function = RuntimeTestXrGetSystemProperties;
        }
        else {
          *function = (PFN_xrVoidFunction)0x0;
        }
      }
    }
    instance_local._4_4_ = XR_ERROR_FUNCTION_UNSUPPORTED;
    if (*function != (PFN_xrVoidFunction)0x0) {
      instance_local._4_4_ = XR_SUCCESS;
    }
  }
  return instance_local._4_4_;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL RuntimeTestXrGetInstanceProcAddr(XrInstance instance, const char *name,
                                                                       PFN_xrVoidFunction *function) {
    if (0 == strcmp(name, "xrGetInstanceProcAddr")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetInstanceProcAddr);
    } else if (0 == strcmp(name, "xrEnumerateInstanceExtensionProperties")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrEnumerateInstanceExtensionProperties);
    } else if (0 == strcmp(name, "xrCreateInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrCreateInstance);
    };
    if (instance == XR_NULL_HANDLE) {
        return XR_ERROR_HANDLE_INVALID;
    }
    if (0 == strcmp(name, "xrDestroyInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrDestroyInstance);
    } else if (0 == strcmp(name, "xrGetSystem")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetSystem);
    } else if (0 == strcmp(name, "xrGetSystemProperties")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetSystemProperties);
    } else {
        *function = nullptr;
    }

    return *function ? XR_SUCCESS : XR_ERROR_FUNCTION_UNSUPPORTED;
}